

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int begin_set_desired_capabilities(BEGIN_HANDLE begin,AMQP_VALUE desired_capabilities_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    iVar2 = 0xcf0;
  }
  else {
    iVar2 = 0xd00;
    if (desired_capabilities_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(desired_capabilities_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(begin->composite_value,6,item_value);
        iVar2 = 0xd06;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int begin_set_desired_capabilities(BEGIN_HANDLE begin, AMQP_VALUE desired_capabilities_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        AMQP_VALUE desired_capabilities_amqp_value;
        if (desired_capabilities_value == NULL)
        {
            desired_capabilities_amqp_value = NULL;
        }
        else
        {
            desired_capabilities_amqp_value = amqpvalue_clone(desired_capabilities_value);
        }
        if (desired_capabilities_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(begin_instance->composite_value, 6, desired_capabilities_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(desired_capabilities_amqp_value);
        }
    }

    return result;
}